

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O0

Unm_Man_t * Unm_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Unm_Man_t *pUVar2;
  abctime aVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  Hash_IntMan_t *pHVar6;
  Vec_Int_t *pVVar7;
  Unm_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pUVar2 = (Unm_Man_t *)calloc(1,0x48);
  aVar3 = Abc_Clock();
  pUVar2->clkStart = aVar3;
  iVar1 = Gia_ManObjNum(pGia);
  pUVar2->nNewSize = (iVar1 * 3) / 2;
  pUVar2->pGia = pGia;
  pGVar4 = Gia_ManStart(pUVar2->nNewSize);
  pUVar2->pNew = pGVar4;
  pcVar5 = Abc_UtilStrsav(pGia->pName);
  pUVar2->pNew->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(pGia->pSpec);
  pUVar2->pNew->pSpec = pcVar5;
  Gia_ManHashAlloc(pUVar2->pNew);
  Gia_ManCleanLevels(pUVar2->pNew,pUVar2->nNewSize);
  pUVar2->pNew->nObjs = pUVar2->nNewSize;
  Gia_ManIncrementTravId(pUVar2->pNew);
  pUVar2->pNew->nObjs = 1;
  pHVar6 = Hash_IntManStart(1000);
  pUVar2->pHash = pHVar6;
  pVVar7 = Vec_IntStart(10);
  pUVar2->vLeaves = pVVar7;
  return pUVar2;
}

Assistant:

Unm_Man_t * Unm_ManAlloc( Gia_Man_t * pGia )
{
    Unm_Man_t * p;
    p = ABC_CALLOC( Unm_Man_t, 1 );
    p->clkStart    = Abc_Clock();
    p->nNewSize    = 3 * Gia_ManObjNum(pGia) / 2;
    p->pGia        = pGia;
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start hashing
    p->pHash = Hash_IntManStart( 1000 );
    // truth tables
    p->vLeaves = Vec_IntStart( 10 );
    return p;
}